

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O1

void __thiscall AllFloatsWriteTest::RunShard(AllFloatsWriteTest *this,int shard)

{
  undefined4 in_register_00000034;
  ulong uVar1;
  char *message;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint32_t them_bits;
  AssertionResult gtest_ar;
  char *endptr;
  char buffer [100];
  uint local_c8;
  float local_c4;
  internal local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  AssertHelper local_a8;
  char *local_a0;
  char local_98 [104];
  
  uVar1 = CONCAT44(in_register_00000034,shard);
  uVar2 = 0xffffffff;
  local_c8 = shard;
  do {
    if ((shard == 0) && (uVar3 = (uint)(uVar1 >> 0x18) & 0xff, uVar3 != uVar2)) {
      printf("value: 0x%08x (%d%%)\r",uVar1,
             (ulong)(uint)(int)(((double)(uVar1 & 0xffffffff) * 100.0) / 4294967295.0));
      fflush(_stdout);
      uVar2 = uVar3;
    }
    if ((~local_c8 & 0x7f800000) != 0) {
      wabt::WriteFloatHex(local_98,100,local_c8);
      local_c4 = strtof(local_98,&local_a0);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_c0,"bits","them_bits",&local_c8,(uint *)&local_c4);
      if (local_c0[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_b0);
        if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_b8->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-hexfloat.cc"
                   ,0x87,message);
        testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_a8);
        if (local_b0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_b0._M_head_impl + 8))();
        }
        if (local_b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          return;
        }
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
        return;
      }
      if (local_b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_b8,local_b8);
      }
    }
    uVar3 = (this->super_ThreadedTest).num_threads_;
    bVar4 = CARRY4(uVar3,local_c8);
    local_c8 = uVar3 + local_c8;
    uVar1 = (ulong)local_c8;
    if (bVar4) {
      if (shard == 0) {
        puts("done.");
        fflush(_stdout);
      }
      return;
    }
  } while( true );
}

Assistant:

virtual void RunShard(int shard) {
    char buffer[100];
    FOREACH_UINT32(bits) {
      LOG_COMPLETION(bits);
      if (is_infinity_or_nan(bits))
        continue;

      WriteFloatHex(buffer, sizeof(buffer), bits);

      char* endptr;
      float them_float = strtof(buffer, &endptr);
      uint32_t them_bits = bit_cast<uint32_t>(them_float);
      ASSERT_EQ(bits, them_bits);
    }
    LOG_DONE();
  }